

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fold_effectiveness.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *input;
  long *plVar2;
  pointer pcVar3;
  undefined8 uVar4;
  bool bVar5;
  basic_regex_implementation<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
  *__tmp;
  any *operand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  string short_name;
  directory_iterator i;
  string file_name;
  path p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> input_dir;
  smatch what;
  directory_iterator end_itr;
  variables_map cmdargs;
  key_type local_458;
  directory_iterator local_430;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_428;
  shared_count sStack_420;
  undefined1 local_418 [56];
  shared_count sStack_3e0;
  error_code local_3d8;
  undefined1 local_3c8 [16];
  name *local_3b8;
  element_type *local_3b0;
  name local_3a8 [2];
  undefined1 local_398 [32];
  uchar uStack_378;
  undefined8 uStack_377;
  uchar auStack_36f [15];
  shared_ptr<boost::re_detail_107400::named_subexpressions> local_360;
  int local_350;
  bool local_34c;
  intrusive_ptr<boost::filesystem::detail::dir_itr_imp> local_340;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  long *local_138;
  long local_130;
  long local_128 [2];
  string local_118;
  string local_f8;
  undefined1 local_d8 [8];
  code *local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_c0 [8];
  _Rb_tree_node_base local_b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90 [48];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  parse_cmdargs((int)local_d0,(char **)(ulong)(uint)argc);
  plVar2 = (long *)(local_398 + 0x10);
  local_398._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"input","");
  operand = (any *)boost::program_options::abstract_variables_map::operator[]((string *)local_d0);
  pbVar6 = boost::any_cast<std::__cxx11::string_const&>(operand);
  local_3b8 = local_3a8;
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3b8,pcVar3,pcVar3 + pbVar6->_M_string_length);
  if ((long *)local_398._0_8_ != plVar2) {
    operator_delete((void *)local_398._0_8_,CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
  }
  boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::basic_regex
            ((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
             ((long)local_418 + 0x30),".*\\.u32",0);
  local_398._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"text","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
          ::find(local_c0,(key_type *)local_398);
  if ((long *)local_398._0_8_ != plVar2) {
    operator_delete((void *)local_398._0_8_,CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
  }
  if (cVar7._M_node != &local_b8) {
    boost::basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>::
    basic_regex((basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_> *)
                &local_3d8,".*\\.txt",0);
    local_398._8_8_ = sStack_3e0.pi_;
    local_398._0_8_ = local_418._48_8_;
    if ((sp_counted_base *)local_3d8.cat_ != (sp_counted_base *)0x0) {
      LOCK();
      *(uint *)&(local_3d8.cat_)->id_ = *(uint *)&(local_3d8.cat_)->id_ + 1;
      UNLOCK();
    }
    local_418._48_4_ = local_3d8.val_;
    local_418[0x34] = local_3d8.failed_;
    local_418._53_3_ = local_3d8._5_3_;
    sStack_3e0.pi_ = (sp_counted_base *)local_3d8.cat_;
    boost::detail::shared_count::~shared_count((shared_count *)(local_398 + 8));
    boost::detail::shared_count::~shared_count((shared_count *)&local_3d8.cat_);
  }
  local_3d8._0_8_ = local_3c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3d8,local_3b8,(long)&local_3b8->index + (long)local_3b0);
  boost::filesystem::detail::status((path *)local_398,&local_3d8);
  if (local_398._0_4_ == 2) {
    boost::filesystem::path::filename();
    boost::basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,boost::regex_traits<char,boost::cpp_regex_traits<char>>> *)
               &local_458,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398,0);
    sStack_420.pi_ = sStack_3e0.pi_;
    local_428._M_current = (char *)local_418._48_8_;
    if ((pointer)local_458._M_string_length != (pointer)0x0) {
      LOCK();
      p_Var1 = &((pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_458._M_string_length)->second;
      *(uint_least32_t *)&p_Var1->_M_current = *(uint_least32_t *)&p_Var1->_M_current + 1;
      UNLOCK();
    }
    local_418._48_8_ = local_458._M_dataplus._M_p;
    sStack_3e0.pi_ = (sp_counted_base *)local_458._M_string_length;
    boost::detail::shared_count::~shared_count(&sStack_420);
    boost::detail::shared_count::~shared_count((shared_count *)((long)&local_458 + 8));
    if ((long *)local_398._0_8_ != plVar2) {
      operator_delete((void *)local_398._0_8_,CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
    }
    boost::filesystem::path::parent_path();
    std::__cxx11::string::_M_assign((string *)&local_3b8);
    if ((long *)local_398._0_8_ != plVar2) {
      operator_delete((void *)local_398._0_8_,CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
    }
  }
  local_340.px = (dir_itr_imp *)0x0;
  local_398._0_8_ = plVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_398,local_3b8,(long)&local_3b8->index + (long)local_3b0);
  boost::filesystem::directory_iterator::directory_iterator(&local_430,(path *)local_398,none);
  if ((long *)local_398._0_8_ != plVar2) {
    operator_delete((void *)local_398._0_8_,CONCAT71(local_398._17_7_,local_398[0x10]) + 1);
  }
  input = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)((long)local_418 + 0x10);
  do {
    if ((local_430.m_imp.px == (intrusive_ptr<boost::filesystem::detail::dir_itr_imp>)local_340.px)
       || (((local_430.m_imp.px == (dir_itr_imp *)0x0 ||
            (*(long *)((long)local_430.m_imp.px + 0x38) == 0)) &&
           ((local_340.px == (dir_itr_imp *)0x0 || (*(long *)(local_340.px + 0x38) == 0)))))) {
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_430.m_imp)
      ;
      boost::intrusive_ptr<boost::filesystem::detail::dir_itr_imp>::~intrusive_ptr(&local_340);
      if ((element_type *)local_3d8._0_8_ != (element_type *)local_3c8) {
        operator_delete((void *)local_3d8._0_8_,(ulong)(local_3c8._0_8_ + 1));
      }
      boost::detail::shared_count::~shared_count(&sStack_3e0);
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8,(long)local_3a8[0] + 1);
      }
      local_d0[0] = std::logic_error::logic_error;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_60);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(local_90);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
      ::~_Rb_tree(local_c0);
      return 0;
    }
    boost::filesystem::directory_entry::get_status((error_code *)local_d8);
    if (local_d8._0_4_ == 2) {
      uStack_378 = '\0';
      uStack_377 = 0;
      auStack_36f[0] = '\0';
      auStack_36f[1] = '\0';
      auStack_36f[2] = '\0';
      auStack_36f[3] = '\0';
      auStack_36f[4] = '\0';
      auStack_36f[5] = '\0';
      auStack_36f[6] = '\0';
      auStack_36f[7] = '\0';
      local_398._0_8_ = (long *)0x0;
      local_398._8_8_ = (pointer)0x0;
      local_398[0x10] = '\0';
      local_398._17_7_ = 0;
      local_398[0x18] = '\0';
      local_398._25_7_ = 0;
      local_360 = (shared_ptr<boost::re_detail_107400::named_subexpressions>)(ZEXT416(0) << 0x40);
      local_350 = 0;
      local_34c = true;
      boost::filesystem::path::filename();
      bVar5 = boost::
              regex_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,boost::regex_traits<char,boost::cpp_regex_traits<char>>>
                        (local_428,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_428._M_current + (long)&(sStack_420.pi_)->_vptr_sp_counted_base),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_398,
                         (basic_regex<char,_boost::regex_traits<char,_boost::cpp_regex_traits<char>_>_>
                          *)((long)local_418 + 0x30),format_default);
      if ((element_type *)local_428._M_current != (element_type *)local_418) {
        operator_delete(local_428._M_current,(ulong)(local_418._0_8_ + 1));
      }
      if (bVar5) {
        local_428._M_current = local_418;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_428,*(long *)((long)local_430.m_imp.px + 8),
                   *(long *)((long)local_430.m_imp.px + 0x10) +
                   *(long *)((long)local_430.m_imp.px + 8));
        local_418._16_8_ = (pointer)0x0;
        local_418._24_8_ = (element_type *)0x0;
        local_418._32_8_ = (sp_counted_base *)0x0;
        local_458._M_dataplus._M_p = (pointer)((long)&local_458 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"text","");
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
                ::find(local_c0,&local_458);
        if (local_458._M_dataplus._M_p != (pointer)((long)&local_458 + 0x10)) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if (cVar7._M_node == &local_b8) {
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_118,local_428._M_current,
                     (long)&(sStack_420.pi_ + -6)[6]._vptr_sp_counted_base +
                     (long)local_428._M_current);
          read_file_u32((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_458,&local_118
                       );
          uVar4 = local_418._32_8_;
          uVar8 = local_418._16_8_;
          local_418._32_8_ = local_458.field_2._M_allocated_capacity;
          local_418._16_8_ = local_458._M_dataplus._M_p;
          local_418._24_8_ = local_458._M_string_length;
          local_458._0_16_ = ZEXT816(0) << 0x20;
          local_458.field_2._M_allocated_capacity = 0;
          if ((pointer)uVar8 != (pointer)0x0) {
            operator_delete((void *)uVar8,uVar4 - uVar8);
          }
          if (local_458._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_458._M_dataplus._M_p,
                            local_458.field_2._M_allocated_capacity -
                            (long)local_458._M_dataplus._M_p);
          }
          uVar8 = local_118.field_2._M_allocated_capacity;
          _Var9._M_p = local_118._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) goto LAB_00126514;
        }
        else {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,local_428._M_current,
                     (long)&(sStack_420.pi_ + -6)[6]._vptr_sp_counted_base +
                     (long)local_428._M_current);
          read_file_text((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_458,&local_f8
                        );
          uVar4 = local_418._32_8_;
          uVar8 = local_418._16_8_;
          local_418._32_8_ = local_458.field_2._M_allocated_capacity;
          local_418._16_8_ = local_458._M_dataplus._M_p;
          local_418._24_8_ = local_458._M_string_length;
          local_458._0_16_ = ZEXT816(0) << 0x20;
          local_458.field_2._M_allocated_capacity = 0;
          if ((pointer)uVar8 != (pointer)0x0) {
            operator_delete((void *)uVar8,uVar4 - uVar8);
          }
          if (local_458._M_dataplus._M_p != (pointer)0x0) {
            operator_delete(local_458._M_dataplus._M_p,
                            local_458.field_2._M_allocated_capacity -
                            (long)local_458._M_dataplus._M_p);
          }
          uVar8 = local_f8.field_2._M_allocated_capacity;
          _Var9._M_p = local_f8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_00126514:
            operator_delete(_Var9._M_p,uVar8 + 1);
          }
        }
        boost::filesystem::path::stem();
        local_458._M_dataplus._M_p = (pointer)((long)&local_458 + 0x10);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_458,local_138,local_130 + (long)local_138);
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_158,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<1u>>(input,&local_158);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_178,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<2u>>(input,&local_178);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p != &local_178.field_2) {
          operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
        }
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_198,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<3u>>(input,&local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p != &local_198.field_2) {
          operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
        }
        local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1b8,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<4u>>(input,&local_1b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
        }
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1d8,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<5u>>(input,&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<6u>>(input,&local_1f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_218,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<7u>>(input,&local_218);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_238,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSfold<8u>>(input,&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<1u>>(input,&local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,
                          (ulong)(local_258.field_2._M_allocated_capacity + 1));
        }
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<2u>>(input,&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,
                          (ulong)(local_278.field_2._M_allocated_capacity + 1));
        }
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<3u>>(input,&local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<4u>>(input,&local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2d8,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<5u>>(input,&local_2d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
        }
        local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f8,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<6u>>(input,&local_2f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
          operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
        }
        local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_318,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<7u>>(input,&local_318);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) {
          operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
        }
        local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_338,local_458._M_dataplus._M_p,
                   local_458._M_dataplus._M_p + local_458._M_string_length);
        run<ANSrfold<8u>>(input,&local_338);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
          operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
        }
        if (local_458._M_dataplus._M_p != (pointer)((long)&local_458 + 0x10)) {
          operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
        }
        if ((pointer)local_418._16_8_ != (pointer)0x0) {
          operator_delete((void *)local_418._16_8_,local_418._32_8_ - local_418._16_8_);
        }
        if ((element_type *)local_428._M_current != (element_type *)local_418) {
          operator_delete(local_428._M_current,(ulong)(local_418._0_8_ + 1));
        }
      }
      boost::
      match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_398);
    }
    boost::filesystem::detail::directory_iterator_increment(&local_430,(error_code *)0x0);
  } while( true );
}

Assistant:

int main(int argc, char const* argv[])
{
    auto cmdargs = parse_cmdargs(argc, argv);
    auto input_dir = cmdargs["input"].as<std::string>();

    boost::regex input_file_filter(".*\\.u32");
    if (cmdargs.count("text")) {
        input_file_filter = boost::regex(".*\\.txt");
    }

    // single file also works!
    boost::filesystem::path p(input_dir);
    if (boost::filesystem::is_regular_file(p)) {
        input_file_filter = boost::regex(p.filename().string());
        input_dir = p.parent_path().string();
    }

    boost::filesystem::directory_iterator
        end_itr; // Default ctor yields past-the-end
    for (boost::filesystem::directory_iterator i(input_dir); i != end_itr;
         ++i) {
        if (!boost::filesystem::is_regular_file(i->status()))
            continue;
        boost::smatch what;
        if (!boost::regex_match(
                i->path().filename().string(), what, input_file_filter))
            continue;

        std::string file_name = i->path().string();
        std::vector<uint32_t> input_u32s;
        if (cmdargs.count("text")) {
            input_u32s = read_file_text(file_name);
        } else {
            input_u32s = read_file_u32(file_name);
        }
        std::string short_name = i->path().stem().string();

        run<ANSfold<1>>(input_u32s, short_name);
        run<ANSfold<2>>(input_u32s, short_name);
        run<ANSfold<3>>(input_u32s, short_name);
        run<ANSfold<4>>(input_u32s, short_name);
        run<ANSfold<5>>(input_u32s, short_name);
        run<ANSfold<6>>(input_u32s, short_name);
        run<ANSfold<7>>(input_u32s, short_name);
        run<ANSfold<8>>(input_u32s, short_name);

        run<ANSrfold<1>>(input_u32s, short_name);
        run<ANSrfold<2>>(input_u32s, short_name);
        run<ANSrfold<3>>(input_u32s, short_name);
        run<ANSrfold<4>>(input_u32s, short_name);
        run<ANSrfold<5>>(input_u32s, short_name);
        run<ANSrfold<6>>(input_u32s, short_name);
        run<ANSrfold<7>>(input_u32s, short_name);
        run<ANSrfold<8>>(input_u32s, short_name);
    }

    return EXIT_SUCCESS;
}